

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O2

FunctionBody * __thiscall
Js::JavascriptExceptionObject::GetFunctionBody(JavascriptExceptionObject *this)

{
  JavascriptFunction *this_00;
  bool bVar1;
  ParseableFunctionInfo *this_01;
  FunctionBody *pFVar2;
  
  this_00 = (this->exceptionContext).m_throwingFunction.ptr;
  if (this_00 != (JavascriptFunction *)0x0) {
    this_01 = JavascriptFunction::GetParseableFunctionInfo(this_00);
    bVar1 = FunctionProxy::IsFunctionBody(&this_01->super_FunctionProxy);
    if (bVar1) {
      pFVar2 = FunctionProxy::GetFunctionBody(&this_01->super_FunctionProxy);
      return pFVar2;
    }
  }
  return (FunctionBody *)0x0;
}

Assistant:

FunctionBody* JavascriptExceptionObject::GetFunctionBody() const
    {
        // If it is a throwing function; it must be deserialized
        if (exceptionContext.ThrowingFunction())
        {
            ParseableFunctionInfo *info = exceptionContext.ThrowingFunction()->GetParseableFunctionInfo();
            if (info->IsFunctionBody())
            {
                return info->GetFunctionBody();
            }
        }
        return nullptr;
    }